

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void AddObjectEntries(cmGeneratorTarget *thisTarget,string *config,
                     vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                     *entries)

{
  string *__return_storage_ptr__;
  bool bVar1;
  TargetType TVar2;
  cmLinkImplementationLibraries *this;
  reference item;
  cmGlobalGenerator *this_00;
  pointer this_01;
  TargetPropertyEntryGenex *this_02;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_f0;
  TargetPropertyEntryGenex *local_e8;
  undefined1 local_e0 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_c8 [8];
  cmGeneratorExpression ge;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string genex;
  string uniqueName;
  cmLinkImplItem *lib;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range2;
  cmLinkImplementationLibraries *impl;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *entries_local;
  string *config_local;
  cmGeneratorTarget *thisTarget_local;
  
  this = cmGeneratorTarget::GetLinkImplementationLibraries(thisTarget,config);
  if (this != (cmLinkImplementationLibraries *)0x0) {
    __end2 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(&this->Libraries);
    lib = (cmLinkImplItem *)
          std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(&this->Libraries);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                       *)&lib), bVar1) {
      item = __gnu_cxx::
             __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
             ::operator*(&__end2);
      if (((item->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0) &&
         (TVar2 = cmGeneratorTarget::GetType((item->super_cmLinkItem).Target),
         TVar2 == OBJECT_LIBRARY)) {
        this_00 = cmGeneratorTarget::GetGlobalGenerator(thisTarget);
        __return_storage_ptr__ = (string *)((long)&genex.field_2 + 8);
        cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
                  (__return_storage_ptr__,this_00,(item->super_cmLinkItem).Target);
        std::operator+(&local_a8,"$<TARGET_OBJECTS:",__return_storage_ptr__);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                       ,&local_a8,">");
        std::__cxx11::string::~string((string *)&local_a8);
        cmListFileBacktrace::cmListFileBacktrace
                  ((cmListFileBacktrace *)&cge,&(item->super_cmLinkItem).Backtrace);
        cmGeneratorExpression::cmGeneratorExpression
                  ((cmGeneratorExpression *)local_c8,(cmListFileBacktrace *)&cge);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
        cmGeneratorExpression::Parse((cmGeneratorExpression *)local_e0,(string *)local_c8);
        this_01 = std::
                  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                  ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                *)local_e0);
        cmCompiledGeneratorExpression::SetEvaluateForBuildsystem(this_01,true);
        this_02 = (TargetPropertyEntryGenex *)operator_new(0x28);
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::unique_ptr(&local_f0,
                     (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      *)local_e0);
        TargetPropertyEntryGenex::TargetPropertyEntryGenex(this_02,&local_f0,item);
        local_e8 = this_02;
        std::
        vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
        ::push_back(entries,(value_type *)&local_e8);
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::~unique_ptr(&local_f0);
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                       *)local_e0);
        cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_c8);
        std::__cxx11::string::~string((string *)local_88);
        std::__cxx11::string::~string((string *)(genex.field_2._M_local_buf + 8));
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

static void AddObjectEntries(
  cmGeneratorTarget const* thisTarget, std::string const& config,
  std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries)
{
  if (cmLinkImplementationLibraries const* impl =
        thisTarget->GetLinkImplementationLibraries(config)) {
    for (cmLinkImplItem const& lib : impl->Libraries) {
      if (lib.Target &&
          lib.Target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        std::string uniqueName =
          thisTarget->GetGlobalGenerator()->IndexGeneratorTargetUniquely(
            lib.Target);
        std::string genex = "$<TARGET_OBJECTS:" + std::move(uniqueName) + ">";
        cmGeneratorExpression ge(lib.Backtrace);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(genex);
        cge->SetEvaluateForBuildsystem(true);
        entries.push_back(new TargetPropertyEntryGenex(std::move(cge), lib));
      }
    }
  }
}